

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

uint __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetMarkCountForSweep
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  SmallHeapBlockBitVector *bv;
  undefined1 auStack_38 [8];
  SmallHeapBlockBitVector temp;
  
  if (this->freeObjectList != this->lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4c5,"(IsFreeBitsValid())","IsFreeBitsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  auStack_38 = (undefined1  [8])0x0;
  temp.data[0].word = 0;
  BVStatic<256UL>::Copy((BVStatic<256UL> *)auStack_38,this->markBits);
  bv = GetInvalidBitVector(this);
  BVStatic<256UL>::Minus((BVStatic<256UL> *)auStack_38,bv);
  if (this->freeCount != 0) {
    BVStatic<256UL>::Minus((BVStatic<256UL> *)auStack_38,&this->freeBits);
  }
  BVar3 = BVStatic<256UL>::Count((BVStatic<256UL> *)auStack_38);
  return BVar3;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountForSweep()
{
    Assert(IsFreeBitsValid());

    // Make a local copy of mark bits, so we don't modify the actual mark bits.
    SmallHeapBlockBitVector temp;
    temp.Copy(this->GetMarkedBitVector());

    // Remove any invalid bits that may have been set
    temp.Minus(this->GetInvalidBitVector());

    // Remove the mark bit for things that are still free
    if (this->freeCount != 0)
    {
        temp.Minus(this->GetFreeBitVector());
    }

    return temp.Count();
}